

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMaybe.hpp
# Opt level: O0

Maybe<vkt::(anonymous_namespace)::RenderQuad> * __thiscall
tcu::Maybe<vkt::(anonymous_namespace)::RenderQuad>::operator=
          (Maybe<vkt::(anonymous_namespace)::RenderQuad> *this,
          Maybe<vkt::(anonymous_namespace)::RenderQuad> *other)

{
  Maybe<vkt::(anonymous_namespace)::RenderQuad> *other_local;
  Maybe<vkt::(anonymous_namespace)::RenderQuad> *this_local;
  
  if (this != other) {
    if (this->m_ptr != (RenderQuad *)0x0) {
      vkt::anon_unknown_0::RenderQuad::~RenderQuad(this->m_ptr);
    }
    if (other->m_ptr == (RenderQuad *)0x0) {
      this->m_ptr = (RenderQuad *)0x0;
    }
    else {
      vkt::anon_unknown_0::RenderQuad::RenderQuad((RenderQuad *)&this->field_1,other->m_ptr);
      this->m_ptr = (RenderQuad *)&this->field_1;
    }
  }
  return this;
}

Assistant:

Maybe<T>& Maybe<T>::operator= (const Maybe<T>& other)
{
	if (this == &other)
		return *this;

	if (m_ptr)
		m_ptr->~T();

	if (other.m_ptr)
		m_ptr = new(m_data)T(*other.m_ptr);
	else
		m_ptr = DE_NULL;

	return *this;
}